

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NEST.cpp
# Opt level: O2

vector<double,_std::allocator<double>_> * __thiscall
NEST::NESTcalc::SetDriftVelocity_NonUniform
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,NESTcalc *this,double rho
          ,double zStep,double kel,double bar,double dx,double dy)

{
  VDetector *pVVar1;
  double dVar2;
  double extraout_XMM0_Qa;
  double dVar3;
  double dVar4;
  double pressure;
  double local_68;
  double local_20;
  
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  dVar4 = 0.0;
  pressure = bar;
  do {
    pVVar1 = this->fdetector;
    dVar2 = pVVar1->TopDrift;
    if (dVar2 <= dVar4) {
      return __return_storage_ptr__;
    }
    local_68 = 0.0;
    for (dVar3 = dVar4; dVar3 < dVar2; dVar3 = dVar3 + zStep) {
      if (dVar4 < pVVar1->gate || dVar4 == pVVar1->gate) {
        (*pVVar1->_vptr_VDetector[4])(dx,dy);
        dVar2 = extraout_XMM0_Qa;
LAB_0010e752:
        pressure = bar;
        dVar2 = SetDriftVelocity(this,kel,rho,dVar2,bar);
      }
      else {
        if (pVVar1->inGas == false) {
          dVar2 = (pVVar1->E_gas / 1.8476719333639615) * 1000.0;
          goto LAB_0010e752;
        }
        dVar2 = GetDriftVelocity_MagBoltz(dVar2,rho,pVVar1->E_gas * 1000.0,pressure,131.293);
      }
      local_68 = local_68 + zStep / dVar2;
      pVVar1 = this->fdetector;
      dVar2 = pVVar1->TopDrift;
    }
    local_20 = (dVar3 - dVar4) / local_68;
    std::vector<double,_std::allocator<double>_>::emplace_back<double>
              (__return_storage_ptr__,&local_20);
    dVar4 = dVar4 + zStep;
  } while( true );
}

Assistant:

vector<double> NESTcalc::SetDriftVelocity_NonUniform(double rho, double zStep, double kel, double bar,
                                                     double dx, double dy) {
  vector<double> speedTable;
  double driftTime, zz;

  for (double pos_z = 0.0; pos_z < fdetector->get_TopDrift(); pos_z += zStep) {
    driftTime = 0.0;
    for (zz = pos_z; zz < fdetector->get_TopDrift(); zz += zStep) {
      if (pos_z > fdetector->get_gate()) {
        if (!fdetector->get_inGas())
          driftTime +=
              zStep / SetDriftVelocity(kel, rho,
                                       fdetector->get_E_gas() /
				       (EPS_LIQ / std::abs(EPS_GAS)) * 1e3, bar);
        else {
          // if gate == TopDrift properly set, shouldn't happen
          driftTime += zStep / GetDriftVelocity_MagBoltz(kel,
					   rho, fdetector->get_E_gas() * 1e3, bar);
        }
      } else {
        driftTime +=
            zStep /
            SetDriftVelocity(
                kel, rho,
                fdetector->FitEF(dx, dy,
                                 zz), bar);  // update x and y if you want 3-D fields
      }
    }

    speedTable.emplace_back((zz - pos_z) / driftTime);  // uses highest zz
  }

  return speedTable;
}